

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

int lj_tab_isempty(GCtab *t)

{
  uint uVar1;
  long lVar2;
  
  if (t->asize != 0) {
    lVar2 = 0;
    do {
      if (*(long *)((t->array).ptr64 + lVar2 * 8) != -1) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (t->asize != (uint32_t)lVar2);
  }
  if (t->hmask != 0) {
    uVar1 = 0;
    do {
      if (*(long *)((t->node).ptr64 + (ulong)uVar1 * 0x18) != -1) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 <= t->hmask);
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_tab_isempty(const GCtab *t)
{
  MSize narr = (MSize)t->asize;
  cTValue *e;
  Node *node;
  MSize i;

  e = tvref(t->array);
  for (i = 0; i < narr; i++)
    if (LJ_LIKELY(!tvisnil(&e[i])))
      return 0;

  if (t->hmask <= 0)
    return 1;

  node = noderef(t->node);
  for (i = 0; i <= (MSize)t->hmask; i++) {
    Node *n = &node[i];
    if (LJ_LIKELY(!tvisnil(&n->val))) {
      return 0;
    }
  }

  return 1;
}